

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

void __thiscall Debugger::Hook(Debugger *this,lua_Debug *ar,lua_State *L)

{
  bool bVar1;
  int iVar2;
  reference exec;
  element_type *peVar3;
  bool local_b9;
  enable_shared_from_this<Debugger> local_b0;
  lock_guard<std::mutex> local_a0;
  lock_guard<std::mutex> lock_1;
  shared_ptr<HookState> state;
  shared_ptr<BreakPoint> local_80;
  undefined1 local_70 [8];
  shared_ptr<BreakPoint> bp;
  function<void_(lua_State_*)> *executor;
  iterator __end3;
  iterator __begin3;
  vector<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>
  *__range3;
  unique_lock<std::mutex> lock;
  lua_State *L_local;
  lua_Debug *ar_local;
  Debugger *this_local;
  
  if ((this->skipHook & 1U) == 0) {
    lock._8_8_ = L;
    SetCurrentState(this,L);
    iVar2 = getDebugEvent(ar);
    if (iVar2 == 2) {
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)&__range3,&this->luaThreadMtx);
      bVar1 = std::
              vector<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>
              ::empty(&this->luaThreadExecutors);
      if (!bVar1) {
        __end3 = std::
                 vector<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>
                 ::begin(&this->luaThreadExecutors);
        executor = (function<void_(lua_State_*)> *)
                   std::
                   vector<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>
                   ::end(&this->luaThreadExecutors);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::function<void_(lua_State_*)>_*,_std::vector<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>_>
                                           *)&executor), bVar1) {
          exec = __gnu_cxx::
                 __normal_iterator<std::function<void_(lua_State_*)>_*,_std::vector<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>_>
                 ::operator*(&__end3);
          ExecuteWithSkipHook(this,exec);
          __gnu_cxx::
          __normal_iterator<std::function<void_(lua_State_*)>_*,_std::vector<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>_>
          ::operator++(&__end3);
        }
        std::
        vector<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>
        ::clear(&this->luaThreadExecutors);
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&__range3);
      FindBreakPoint((Debugger *)local_70,(lua_Debug *)this);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_70);
      local_b9 = false;
      if (bVar1) {
        std::shared_ptr<BreakPoint>::shared_ptr(&local_80,(shared_ptr<BreakPoint> *)local_70);
        local_b9 = ProcessBreakPoint(this,&local_80);
        std::shared_ptr<BreakPoint>::~shared_ptr(&local_80);
      }
      if (local_b9 == false) {
        std::shared_ptr<HookState>::shared_ptr((shared_ptr<HookState> *)&lock_1,(nullptr_t)0x0);
        std::lock_guard<std::mutex>::lock_guard(&local_a0,&this->hookStateMtx);
        std::shared_ptr<HookState>::operator=((shared_ptr<HookState> *)&lock_1,&this->hookState);
        std::lock_guard<std::mutex>::~lock_guard(&local_a0);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&lock_1);
        if (bVar1) {
          peVar3 = std::__shared_ptr_access<HookState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<HookState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&lock_1);
          std::enable_shared_from_this<Debugger>::shared_from_this(&local_b0);
          (*peVar3->_vptr_HookState[3])(peVar3,&local_b0,this->currentL,ar);
          std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)&local_b0);
        }
        std::shared_ptr<HookState>::~shared_ptr((shared_ptr<HookState> *)&lock_1);
      }
      else {
        HandleBreak(this);
      }
      std::shared_ptr<BreakPoint>::~shared_ptr((shared_ptr<BreakPoint> *)local_70);
    }
  }
  return;
}

Assistant:

void Debugger::Hook(lua_Debug *ar, lua_State *L) {
	if (skipHook) {
		return;
	}
	// 设置当前协程
	SetCurrentState(L);

	if (getDebugEvent(ar) == LUA_HOOKLINE) {
		// 对luaTreadExecutors 执行加锁
		{
			std::unique_lock<std::mutex> lock(luaThreadMtx);
			if (!luaThreadExecutors.empty()) {
				for (auto &executor: luaThreadExecutors) {
					ExecuteWithSkipHook(executor);
				}
				luaThreadExecutors.clear();
			}
		}
		auto bp = FindBreakPoint(ar);
		if (bp && ProcessBreakPoint(bp)) {
			HandleBreak();
			return;
		}
		// 加锁

		std::shared_ptr<HookState> state = nullptr;

		{
			std::lock_guard<std::mutex> lock(hookStateMtx);
			state = hookState;
		}

		if (state) {
			state->ProcessHook(shared_from_this(), currentL, ar);
		}
	}
}